

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O0

void __thiscall
OpenMD::ForceMatrixDecomposition::unpackInteractionData
          (ForceMatrixDecomposition *this,InteractionData *idat,int atom1,int atom2)

{
  double dVar1;
  double dVar2;
  reference pvVar3;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  Vector<double,_7U> *in_stack_ffffffffffffff58;
  Vector<double,_7U> *in_stack_ffffffffffffff60;
  value_type vVar4;
  
  Vector<double,_7U>::operator+=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  Vector<double,_7U>::operator+=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  Vector<double,_7U>::operator+=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
             (*(long *)(in_RDI + 0x18) + 0x30),(long)in_EDX);
  Vector<double,_3U>::operator+=
            ((Vector<double,_3U> *)in_stack_ffffffffffffff60,
             (Vector<double,_3U> *)in_stack_ffffffffffffff58);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
             (*(long *)(in_RDI + 0x18) + 0x30),(long)in_ECX);
  Vector<double,_3U>::operator-=
            ((Vector<double,_3U> *)in_stack_ffffffffffffff60,
             (Vector<double,_3U> *)in_stack_ffffffffffffff58);
  if ((*(byte *)(in_RSI + 0xd8) & 1) != 0) {
    dVar1 = *(double *)(in_RSI + 0xd0);
    dVar2 = *(double *)(in_RSI + 0x40);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*(long *)(in_RDI + 0x18) + 0x90)
                        ,(long)in_EDX);
    *pvVar3 = dVar1 * dVar2 + *pvVar3;
    dVar1 = *(double *)(in_RSI + 0xd0);
    dVar2 = *(double *)(in_RSI + 0x40);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*(long *)(in_RDI + 0x18) + 0x90)
                        ,(long)in_ECX);
    *pvVar3 = dVar1 * dVar2 + *pvVar3;
  }
  if ((*(uint *)(in_RDI + 0x30) & 0x10000) != 0) {
    dVar1 = *(double *)(in_RSI + 0x300);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        (*(long *)(in_RDI + 0x18) + 0x180),(long)in_EDX);
    *pvVar3 = *pvVar3 - dVar1;
    dVar1 = *(double *)(in_RSI + 0x308);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        (*(long *)(in_RDI + 0x18) + 0x180),(long)in_ECX);
    *pvVar3 = *pvVar3 - dVar1;
  }
  if ((*(uint *)(in_RDI + 0x30) & 0x1000) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (*(long *)(in_RDI + 0x18) + 0x120),(long)in_EDX);
    Vector<double,_3U>::operator+=
              ((Vector<double,_3U> *)in_stack_ffffffffffffff60,
               (Vector<double,_3U> *)in_stack_ffffffffffffff58);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (*(long *)(in_RDI + 0x18) + 0x120),(long)in_ECX);
    Vector<double,_3U>::operator+=
              ((Vector<double,_3U> *)in_stack_ffffffffffffff60,
               (Vector<double,_3U> *)in_stack_ffffffffffffff58);
  }
  if ((*(uint *)(in_RDI + 0x30) & 0x20000) != 0) {
    dVar1 = *(double *)(in_RSI + 0x350);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        (*(long *)(in_RDI + 0x18) + 0x198),(long)in_EDX);
    *pvVar3 = dVar1 + *pvVar3;
    dVar1 = *(double *)(in_RSI + 0x358);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        (*(long *)(in_RDI + 0x18) + 0x198),(long)in_ECX);
    *pvVar3 = dVar1 + *pvVar3;
  }
  if ((*(uint *)(in_RDI + 0x30) & 0x20) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (*(long *)(in_RDI + 0x18) + 0x78),(long)in_EDX);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_ffffffffffffff60,
               (Vector3<double> *)in_stack_ffffffffffffff58);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (*(long *)(in_RDI + 0x18) + 0x78),(long)in_ECX);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_ffffffffffffff60,
               (Vector3<double> *)in_stack_ffffffffffffff58);
  }
  if ((*(uint *)(in_RDI + 0x30) & 0x2000) != 0) {
    vVar4 = *(value_type *)(in_RSI + 0x340);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        (*(long *)(in_RDI + 0x18) + 0x138),(long)in_EDX);
    *pvVar3 = vVar4;
    vVar4 = *(value_type *)(in_RSI + 0x348);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        (*(long *)(in_RDI + 0x18) + 0x138),(long)in_ECX);
    *pvVar3 = vVar4;
  }
  return;
}

Assistant:

void ForceMatrixDecomposition::unpackInteractionData(InteractionData& idat,
                                                       int atom1, int atom2) {
#ifdef IS_MPI
    pot_row[atom1] += 0.5 * idat.pot;
    pot_col[atom2] += 0.5 * idat.pot;
    expot_row[atom1] += 0.5 * idat.excludedPot;
    expot_col[atom2] += 0.5 * idat.excludedPot;
    selepot_row[atom1] += 0.5 * idat.selePot;
    selepot_col[atom2] += 0.5 * idat.selePot;

    atomRowData.force[atom1] += idat.f1;
    atomColData.force[atom2] -= idat.f1;

    if (atomStorageLayout_ & DataStorage::dslFlucQForce) {
      atomRowData.flucQFrc[atom1] -= idat.dVdFQ1;
      atomColData.flucQFrc[atom2] -= idat.dVdFQ2;
    }

    if (atomStorageLayout_ & DataStorage::dslElectricField) {
      atomRowData.electricField[atom1] += idat.eField1;
      atomColData.electricField[atom2] += idat.eField2;
    }

    if (atomStorageLayout_ & DataStorage::dslSitePotential) {
      atomRowData.sitePotential[atom1] += idat.sPot1;
      atomColData.sitePotential[atom2] += idat.sPot2;
    }

    if (atomStorageLayout_ & DataStorage::dslTorque) {
      atomRowData.torque[atom1] = idat.t1;
      atomColData.torque[atom2] = idat.t2;
    }

    if (atomStorageLayout_ & DataStorage::dslSkippedCharge) {
      atomRowData.skippedCharge[atom1] = idat.skippedCharge1;
      atomColData.skippedCharge[atom2] = idat.skippedCharge2;
    }

#else
    pairwisePot += idat.pot;
    excludedPot += idat.excludedPot;
    selectedPot += idat.selePot;

    snap_->atomData.force[atom1] += idat.f1;
    snap_->atomData.force[atom2] -= idat.f1;

    if (idat.doParticlePot) {
      // This is the pairwise contribution to the particle pot.  The
      // self and embedding contribution is added in each of the low
      // level non-bonded routines.  In parallel, this calculation is
      // done in collectData, not in unpackInteractionData.
      snap_->atomData.particlePot[atom1] += idat.vpair * idat.sw;
      snap_->atomData.particlePot[atom2] += idat.vpair * idat.sw;
    }

    if (atomStorageLayout_ & DataStorage::dslFlucQForce) {
      snap_->atomData.flucQFrc[atom1] -= idat.dVdFQ1;
      snap_->atomData.flucQFrc[atom2] -= idat.dVdFQ2;
    }

    if (atomStorageLayout_ & DataStorage::dslElectricField) {
      snap_->atomData.electricField[atom1] += idat.eField1;
      snap_->atomData.electricField[atom2] += idat.eField2;
    }

    if (atomStorageLayout_ & DataStorage::dslSitePotential) {
      snap_->atomData.sitePotential[atom1] += idat.sPot1;
      snap_->atomData.sitePotential[atom2] += idat.sPot2;
    }

    if (atomStorageLayout_ & DataStorage::dslTorque) {
      snap_->atomData.torque[atom1] = idat.t1;
      snap_->atomData.torque[atom2] = idat.t2;
    }

    if (atomStorageLayout_ & DataStorage::dslSkippedCharge) {
      snap_->atomData.skippedCharge[atom1] = idat.skippedCharge1;
      snap_->atomData.skippedCharge[atom2] = idat.skippedCharge2;
    }

#endif
  }